

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O3

void __thiscall
TasGrid::GridGlobal::setSurplusRefinement
          (GridGlobal *this,double tolerance,int output,
          vector<int,_std::allocator<int>_> *level_limits)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  MultiIndexSet kids;
  vector<double,_std::allocator<double>_> surp;
  allocator_type local_91;
  MultiIndexSet local_90;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<bool,_std::allocator<bool>_> local_48;
  
  local_68 = tolerance;
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
  computeSurpluses(&local_60,this,output,true);
  iVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  local_90.num_dimensions = local_90.num_dimensions & 0xffffffffffffff00;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_48,(long)iVar1,(bool *)&local_90,&local_91);
  if (0 < iVar1) {
    uVar2 = 0;
    do {
      uVar3 = 1L << ((byte)uVar2 & 0x3f);
      uVar4 = uVar2 >> 6 & 0x3ffffff;
      if (ABS(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar2]) <= local_68) {
        uVar3 = ~uVar3 & local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4];
      }
      else {
        uVar3 = uVar3 | local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4];
      }
      local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar4] = uVar3;
      uVar2 = uVar2 + 1;
    } while ((long)iVar1 != uVar2);
  }
  MultiIndexManipulations::selectFlaggedChildren
            (&local_90,&(this->super_BaseCanonicalGrid).points,
             (vector<bool,_std::allocator<bool>_> *)&local_48,
             (vector<int,_std::allocator<int>_> *)level_limits);
  if (local_90.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_90.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    local_90.num_dimensions = (this->super_BaseCanonicalGrid).points.num_dimensions;
    MultiIndexSet::addSortedIndexes(&local_90,&(this->super_BaseCanonicalGrid).points.indexes);
    MultiIndexManipulations::completeSetToLower(&local_90);
    (this->updated_tensors).cache_num_indexes = local_90.cache_num_indexes;
    (this->updated_tensors).num_dimensions = local_90.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(this->updated_tensors).indexes,&local_90.indexes);
    proposeUpdatedTensors(this);
  }
  if (local_90.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_90.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridGlobal::setSurplusRefinement(double tolerance, int output, const std::vector<int> &level_limits){
    clearRefinement();
    std::vector<double> surp = computeSurpluses(output, true);

    int n = points.getNumIndexes();
    std::vector<bool> flagged(n);

    for(int i=0; i<n; i++)
        flagged[i] = (std::abs(surp[i]) > tolerance);

    MultiIndexSet kids = MultiIndexManipulations::selectFlaggedChildren(points, flagged, level_limits);

    if (!kids.empty()){
        kids += points;
        MultiIndexManipulations::completeSetToLower(kids);

        updated_tensors = std::move(kids);
        proposeUpdatedTensors();
    }
}